

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sol-reader2.hpp
# Opt level: O2

NLW2_SOLReadResultCode __thiscall
mp::SOLReader2<mp::SOLHandler_Easy>::gsufread(SOLReader2<mp::SOLHandler_Easy> *this,FILE *f)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  long lVar5;
  char *pcVar6;
  size_t sVar7;
  char *pcVar8;
  ulong __n;
  NLW2_SOLReadResultCode NVar9;
  NLW2_SOLReadResultCode unaff_R12D;
  NLW2_SOLReadResultCode *rr;
  allocator<char> local_439;
  FILE *local_438;
  char *s;
  NLW2_SOLReadResultCode *local_428;
  SufRead SR;
  SuffixInfo si;
  string local_388;
  SuffixReader<int> sr;
  string local_2e8;
  SuffixInfo local_2c8;
  SuffixInfo local_280;
  char buf [512];
  
  local_428 = &this->readresult_;
  local_438 = (FILE *)f;
  do {
    rr = local_428;
    pcVar4 = fgets(buf,0x1ff,local_438);
    if (pcVar4 == (char *)0x0) {
      return NLW2_SOLRead_OK;
    }
    SR.xp.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)0x0;
    SR.xp.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish
         = (pointer)0x0;
    SR.xp.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    iVar3 = bcmp(buf,"suffix ",7);
    if (iVar3 == 0) {
      s = buf + 7;
      iVar3 = Lget(&s,&SR.h.kind);
      if ((((iVar3 != 0) || (iVar3 = Lget(&s,&SR.h.n), iVar3 != 0)) ||
          (iVar3 = Lget(&s,&SR.h.namelen), iVar3 != 0)) ||
         ((iVar3 = Lget(&s,&SR.h.tablen), iVar3 != 0 || (iVar3 = Lget(&s,&SR.tablines), iVar3 != 0))
         )) {
        std::__cxx11::string::string<std::allocator<char>>((string *)&sr,buf,(allocator<char> *)&si)
        ;
        unaff_R12D = ReportBadLine(this,(string *)&sr);
        goto LAB_00115048;
      }
      iVar3 = sufheadcheck(this,&SR);
      if (iVar3 != 0) {
        std::__cxx11::string::string<std::allocator<char>>((string *)&sr,buf,(allocator<char> *)&si)
        ;
        unaff_R12D = ReportBadLine(this,(string *)&sr);
        goto LAB_00115048;
      }
      pcVar4 = fgets(buf,0x1ff,local_438);
      if (pcVar4 == (char *)0x0) {
LAB_00115160:
        std::__cxx11::string::string<std::allocator<char>>((string *)&sr,buf,(allocator<char> *)&si)
        ;
        unaff_R12D = ReportBadLine(this,(string *)&sr);
        goto LAB_00115048;
      }
      lVar5 = (long)SR.h.namelen;
      cVar1 = buf[lVar5 + -1];
      if ((cVar1 != '\n') && ((cVar1 != '\r' || (buf[lVar5] != '\n')))) goto LAB_00115160;
      buf[lVar5 + -1] = '\0';
      strcpy(SR.name,buf);
      if ((long)SR.h.tablen != 0) {
        pcVar4 = SR.table + SR.h.tablen;
        s = SR.table;
        for (iVar3 = 1; iVar3 < SR.tablines; iVar3 = iVar3 + 1) {
          pcVar6 = fgets(s,(int)pcVar4 - (int)s,local_438);
          pcVar8 = s;
          if (pcVar6 == (char *)0x0) {
            unaff_R12D = ReportEarlyEof(this);
            goto LAB_00115053;
          }
          sVar7 = strlen(s);
          s = pcVar8 + sVar7;
        }
        pcVar8 = fgets(buf,0x1ff,local_438);
        if (pcVar8 != (char *)0x0) {
          sVar7 = strlen(buf);
          rr = local_428;
          if (((sVar7 == 0) || (buf[sVar7 - 1] != '\n')) ||
             (__n = sVar7 - 1, (ulong)((long)pcVar4 - (long)s) <= __n)) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&sr,buf,(allocator<char> *)&si);
            unaff_R12D = ReportBadLine(this,(string *)&sr);
            goto LAB_00115048;
          }
          if ((__n != 0) && ((buf[sVar7 - 2] != '\r' || (__n = sVar7 - 2, __n != 0)))) {
            buf[__n] = '\0';
            memcpy(s,buf,__n);
          }
          goto LAB_001151fc;
        }
        unaff_R12D = ReportEarlyEof(this);
        goto LAB_00115053;
      }
LAB_001151fc:
      iVar3 = SR.h.kind;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_388,SR.name,(allocator<char> *)&sr);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_2e8,SR.table,&local_439);
      SuffixInfo::SuffixInfo(&si,iVar3,&local_388,&local_2e8);
      std::__cxx11::string::~string((string *)&local_2e8);
      std::__cxx11::string::~string((string *)&local_388);
      if ((SR.h.kind & 4U) == 0) {
        SuffixInfo::SuffixInfo(&local_2c8,&si);
        SuffixReader<int>::SuffixReader(&sr,&local_2c8,(FILE *)local_438,this->binary,SR.h.n);
        SuffixInfo::~SuffixInfo(&local_2c8);
        SOLHandler_Easy::OnSuffix<mp::SuffixReader<int>>(this->solh_,&sr);
        bVar2 = CheckReader<mp::SuffixReader<int>>(this,&sr,rr);
        NVar9 = *rr;
        SuffixReader<int>::~SuffixReader(&sr);
      }
      else {
        SuffixInfo::SuffixInfo(&local_280,&si);
        SuffixReader<double>::SuffixReader
                  ((SuffixReader<double> *)&sr,&local_280,(FILE *)local_438,this->binary,SR.h.n);
        SuffixInfo::~SuffixInfo(&local_280);
        SOLHandler_Easy::OnSuffix<mp::SuffixReader<double>>(this->solh_,(SuffixReader<double> *)&sr)
        ;
        bVar2 = CheckReader<mp::SuffixReader<double>>(this,(SuffixReader<double> *)&sr,rr);
        NVar9 = *rr;
        SuffixReader<double>::~SuffixReader((SuffixReader<double> *)&sr);
      }
      bVar2 = bVar2 != false;
      if (bVar2) {
        NVar9 = unaff_R12D;
      }
      unaff_R12D = NVar9;
      SuffixInfo::~SuffixInfo(&si);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>((string *)&sr,buf,(allocator<char> *)&si);
      unaff_R12D = ReportBadLine(this,(string *)&sr);
LAB_00115048:
      std::__cxx11::string::~string((string *)&sr);
LAB_00115053:
      bVar2 = false;
    }
    std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
              (&SR.xp.super__Vector_base<char,_std::allocator<char>_>);
    if (!bVar2) {
      return unaff_R12D;
    }
  } while( true );
}

Assistant:

NLW2_SOLReadResultCode SOLReader2<SOLHandler>::gsufread(FILE* f) {
  char *s, *se;
  size_t L;
  char buf[512];

  while(fgets(buf, sizeof(buf)-1, f)) {
    SufRead SR;
    if (strncmp(buf, "suffix ", 7))
      return ReportBadLine(buf);
    s = buf + 7;
    if (Lget(&s, &SR.h.kind)
        || Lget(&s, &SR.h.n)
        || Lget(&s, &SR.h.namelen)
        || Lget(&s, &SR.h.tablen)
        || Lget(&s, &SR.tablines))
      return ReportBadLine(buf);
    if (sufheadcheck(&SR))
      return ReportBadLine(buf);
    if (!fgets(buf, sizeof(buf)-1, f)
        || (buf[SR.h.namelen-1] != '\n'
            && (buf[SR.h.namelen-1] != '\r'
                || buf[SR.h.namelen] != '\n')))
      return ReportBadLine(buf);
    buf[SR.h.namelen-1] = 0;
    strcpy(SR.name, buf);
    if (SR.h.tablen) {
      s = SR.table;
      se = s + SR.h.tablen;
      for(int i = 1; i < SR.tablines; i++) {
        if (!fgets(s, se-s, f))
          return ReportEarlyEof();
        s += strlen(s);
      }
      if (!fgets(buf, sizeof(buf)-1, f))
        return ReportEarlyEof();
      if (!(L = strlen(buf)) || buf[--L] != '\n'
          || L >= (size_t)(se - s))
        return ReportBadLine(buf);
      if (L) {
        if (buf[L-1] != '\r' || --L) {
          buf[L] = 0;
          memcpy(s, buf, L);
        }
      }
    }
    SuffixInfo si(SR.h.kind, SR.name, SR.table);
    if (SR.h.kind & 4) {        // real-valued
      SuffixReader<double> sr(std::move(si), f, binary, SR.h.n);
      Handler().OnDblSuffix(sr);
      if (!CheckReader( sr, readresult_ ))
        return readresult_;
    } else {                    // int-valued
      SuffixReader<int> sr(std::move(si), f, binary, SR.h.n);
      Handler().OnIntSuffix(sr);
      if (!CheckReader( sr, readresult_ ))
        return readresult_;
    }
    //		sufput(&SR, ac, newsufs);
  }
  return NLW2_SOLRead_OK;
}